

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

void register_logging(char *filename,uint32_t *cats,int *level)

{
  list<file_data> *plVar1;
  int iVar2;
  Node *pNVar3;
  Node *pNVar4;
  
  if (first_register == '\0') {
    logging_init();
  }
  plVar1 = file_data_list;
  pNVar4 = file_data_list->mHead;
  pNVar3 = file_data_list->mTail;
  do {
    pNVar4 = pNVar4->next;
    if (pNVar4 == pNVar3) {
      pNVar3 = (Node *)operator_new(0x28,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                    ,0xa7);
      (pNVar3->val).filename = filename;
      (pNVar3->val).cats = cats;
      (pNVar3->val).level = level;
      pNVar4 = plVar1->mTail;
      pNVar3->prev = pNVar4->prev;
      pNVar3->next = pNVar4;
      pNVar4->prev->next = pNVar3;
      pNVar4->prev = pNVar3;
      goto LAB_00123312;
    }
    iVar2 = strcasecmp((pNVar4->val).filename,filename);
  } while (iVar2 < 1);
  pNVar4 = pNVar4->prev;
  pNVar3 = (Node *)operator_new(0x28);
  (pNVar3->val).filename = filename;
  (pNVar3->val).cats = cats;
  (pNVar3->val).level = level;
  pNVar3->prev = pNVar4;
  pNVar3->next = pNVar4->next;
  pNVar4->next->prev = pNVar3;
  pNVar4->next = pNVar3;
LAB_00123312:
  if (jh_log_names_buffer != (char *)0x0) {
    free(jh_log_names_buffer);
    jh_log_names_buffer = (char *)0x0;
  }
  return;
}

Assistant:

void register_logging( const char *filename, uint32_t *cats, int *level )
{
	struct file_data node;

	TRACE_BEGIN(LOG_LVL_INFO);

	if ( first_register )
		logging_init();

	node.filename = filename;
	node.cats = cats;
	node.level = level;

	bool found = false;
	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		if ( strcasecmp( i->filename, filename) > 0 )
		{
			i.insertBefore(node);
			found = true;
			break;
		}
	}
	
	if ( not found )
	{
		file_data_list->push_back(node);
	}

	// if we have already built the name buffer then delete it since we just 
	//  changed it.
	if ( jh_log_names_buffer != NULL )
	{
		LOGGING_FREE( jh_log_names_buffer );
		jh_log_names_buffer = NULL;
	}
	
	TRACE_END();
}